

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wsntopologybasedenergy.cpp
# Opt level: O3

void __thiscall WSNTopologyBasedEnergy::NodeSentSignalVarPower(WSNTopologyBasedEnergy *this)

{
  WSNNode *pWVar1;
  Scalar *pSVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int i;
  ulong uVar24;
  int j;
  ulong uVar25;
  int iVar26;
  long lVar27;
  WSNTopologyBasedEnergy *pWVar28;
  WSNTopologyBasedEnergy *pWVar29;
  pointer piVar30;
  WSNNode *pWVar31;
  int *piStack_740;
  undefined1 auStack_728 [16];
  _InputArray _Stack_718;
  WSNNode *pWStack_700;
  undefined1 auStack_6f8 [16];
  Size SStack_6e8;
  undefined8 uStack_6e0;
  WSNNode *pWStack_6d8;
  Scalar *pSStack_6d0;
  Scalar *pSStack_6c8;
  Scalar *pSStack_6c0;
  WSNNode *pWStack_6b8;
  Scalar *pSStack_6b0;
  WSNNode *pWStack_6a8;
  Scalar *pSStack_6a0;
  WSNNode *pWStack_698;
  undefined8 uStack_690;
  double dStack_688;
  double dStack_680;
  vector<int,_std::allocator<int>_> vStack_678;
  undefined8 uStack_660;
  int iStack_658;
  int iStack_654;
  undefined4 uStack_650;
  undefined4 uStack_64c;
  undefined8 uStack_648;
  double dStack_640;
  undefined8 uStack_638;
  double dStack_630;
  double dStack_628;
  double dStack_620;
  double dStack_618;
  WSNNode WStack_608;
  WSNNode WStack_5c8;
  WSNNode WStack_588;
  undefined8 uStack_548;
  double dStack_540;
  undefined8 uStack_538;
  double dStack_530;
  double dStack_528;
  double dStack_520;
  double dStack_518;
  WSNNode WStack_508;
  undefined8 uStack_4c8;
  double dStack_4c0;
  undefined8 uStack_4b8;
  double dStack_4b0;
  double dStack_4a8;
  double dStack_4a0;
  double dStack_498;
  WSNNode WStack_488;
  undefined8 uStack_448;
  double dStack_440;
  undefined8 uStack_438;
  double dStack_430;
  double dStack_428;
  double dStack_420;
  double dStack_418;
  WSNNode WStack_408;
  double *apdStack_3c8 [2];
  double adStack_3b8 [10];
  undefined8 uStack_368;
  double dStack_360;
  undefined8 uStack_358;
  double dStack_350;
  double dStack_348;
  double dStack_340;
  double dStack_338;
  WSNNode WStack_328;
  undefined8 uStack_2e8;
  double dStack_2e0;
  double dStack_2d8;
  double dStack_2d0;
  double dStack_2c8;
  double dStack_2c0;
  double dStack_2b8;
  WSNNode WStack_2a8;
  undefined8 uStack_268;
  double dStack_260;
  undefined8 uStack_258;
  double dStack_250;
  double dStack_248;
  double dStack_240;
  double dStack_238;
  WSNNode WStack_228;
  undefined8 uStack_1e8;
  double dStack_1e0;
  undefined8 uStack_1d8;
  double dStack_1d0;
  double dStack_1c8;
  double dStack_1c0;
  double dStack_1b8;
  WSNNode WStack_1a8;
  WSNNode WStack_168;
  WSNNode WStack_128;
  WSNNode WStack_e8;
  WSNNode WStack_a8;
  undefined1 auStack_70 [64];
  
  iVar21 = this->Mark[0];
  uVar24 = 0;
  uVar25 = 0;
  iVar22 = iVar21;
  do {
    if (this->Mark[uVar24] < iVar22) {
      uVar25 = uVar24 & 0xffffffff;
      iVar22 = this->Mark[uVar24];
    }
    uVar24 = uVar24 + 1;
  } while (uVar24 != 5);
  if ((int)uVar25 == 0) {
    SelectServalNode(&vStack_678,this);
    if (vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pWVar31 = this->LayerLeaderNode;
      pWStack_6a8 = this->LayerLeaderNode + 4;
      pSStack_6b0 = &this->LayerLeaderNode[4].color;
      pWStack_6d8 = this->LayerLeaderNode + 3;
      pSStack_6d0 = &this->LayerLeaderNode[3].color;
      auStack_728._8_8_ = this->LayerLeaderNode + 1;
      auStack_728._0_8_ = this->LayerLeaderNode + 2;
      iStack_658 = 0;
      iStack_654 = 0;
      uStack_650 = 0;
      uStack_64c = 0x406fe000;
      pSStack_6c8 = &this->LayerLeaderNode[2].color;
      pSStack_6c0 = &this->LayerLeaderNode[1].color;
      pWStack_6b8 = (WSNNode *)&this->LayerLeaderNode[0].color;
      pWStack_698 = &this->sink;
      pSStack_6a0 = &(this->sink).color;
      piVar30 = vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        cv::Mat::clone();
        SelectLeaderID(this);
        uStack_6e0 = 0;
        auStack_6f8._8_4_ = 0x3010000;
        uStack_660 = 0;
        dStack_680 = *(double *)pWVar31;
        _Stack_718.flags = 0;
        _Stack_718._4_4_ = 0x40468000;
        _Stack_718.obj = (void *)0x4062c00000000000;
        _Stack_718.sz.width = 0;
        _Stack_718.sz.height = 0x40468000;
        pWStack_700 = (WSNNode *)0x0;
        SStack_6e8 = (Size)apdStack_3c8;
        cv::line(auStack_6f8 + 8,&uStack_660,&dStack_680,(Size *)&_Stack_718,1,8,0);
        lVar27 = 0x18e8;
        do {
          uStack_6e0 = 0;
          auStack_6f8._8_4_ = 0x3010000;
          dStack_688 = *(double *)((long)(&(this->sink).color + -4) + lVar27);
          uStack_690 = *(undefined8 *)
                        ((long)(this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                        + lVar27 + -0x48);
          _Stack_718._4_4_ = iStack_654;
          _Stack_718.flags = iStack_658;
          _Stack_718.obj = (void *)CONCAT44(uStack_64c,uStack_650);
          _Stack_718.sz.width = 0;
          _Stack_718.sz.height = 0;
          pWStack_700 = (WSNNode *)0x0;
          SStack_6e8 = (Size)apdStack_3c8;
          cv::line(auStack_6f8 + 8,&dStack_688,&uStack_690,(Size *)&_Stack_718,1,8,0);
          _Stack_718._0_8_ = &_Stack_718.sz;
          std::__cxx11::string::_M_construct<char_const*>((string *)&_Stack_718,"WSN","");
          uStack_6e0 = 0;
          auStack_6f8._8_4_ = 0x1010000;
          SStack_6e8 = (Size)apdStack_3c8;
          cv::imshow((string *)&_Stack_718,(_InputArray *)(auStack_6f8 + 8));
          if ((Size *)_Stack_718._0_8_ != &_Stack_718.sz) {
            operator_delete((void *)_Stack_718._0_8_,(ulong)((long)_Stack_718.sz + 1));
          }
          lVar27 = lVar27 + 0x38;
        } while (lVar27 != 0x19c8);
        if (this->Test != false) {
          cv::waitKey(100);
        }
        iVar21 = WSNNode::layer(this->node + *piVar30);
        if (iVar21 == 0) {
          dVar4 = this->alpha;
          WStack_408.leaderID = this->LayerLeaderNode[0].leaderID;
          WStack_408.id = this->LayerLeaderNode[0].id;
          uVar6._0_4_ = pWVar31->x;
          uVar6._4_4_ = pWVar31->y;
          WStack_408.energy = this->LayerLeaderNode[0].energy;
          WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               *(double *)pWStack_6b8;
          WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               pWStack_6b8->energy;
          WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               *(double *)&pWStack_6b8->leaderID;
          WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          uStack_438._0_4_ = pWStack_698->leaderID;
          uStack_438._4_4_ = pWStack_698->id;
          dVar5 = *(double *)pWStack_698;
          dStack_440 = pWStack_698->energy;
          dStack_430 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_428 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_420 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_418 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_448._0_4_ = SUB84(dVar5,0);
          iVar21 = (int)uStack_448;
          uStack_448._4_4_ = (int)((ulong)dVar5 >> 0x20);
          iVar22 = uStack_448._4_4_;
          uStack_448 = dVar5;
          WStack_408._0_8_ = uVar6;
          iVar26 = WSNNode::GetNodeID(pWVar31);
          this->node[iVar26].energy =
               this->node[iVar26].energy -
               (dVar4 * (double)(((int)uVar6 - iVar21) * ((int)uVar6 - iVar21) +
                                (uVar6._4_4_ - iVar22) * (uVar6._4_4_ - iVar22)) + 1.0);
          WSNNode::~WSNNode((WSNNode *)&uStack_448);
          WSNNode::~WSNNode(&WStack_408);
          iVar21 = *piVar30;
          WStack_128.leaderID = this->node[iVar21].leaderID;
          WStack_128.id = this->node[iVar21].id;
          pWVar1 = this->node + iVar21;
          WStack_128.x = pWVar1->x;
          WStack_128.y = pWVar1->y;
          WStack_128.energy = pWVar1->energy;
          pSVar2 = &this->node[iVar21].color;
          WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
          WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
          WStack_168.leaderID = this->LayerLeaderNode[0].leaderID;
          WStack_168.id = this->LayerLeaderNode[0].id;
          WStack_168.x = pWVar31->x;
          WStack_168.y = pWVar31->y;
          WStack_168.energy = this->LayerLeaderNode[0].energy;
          WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               *(double *)pWStack_6b8;
          WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               pWStack_6b8->energy;
          WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               *(double *)&pWStack_6b8->leaderID;
          WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          this->node[iVar21].energy =
               this->node[iVar21].energy -
               ((double)((WStack_128.y - WStack_168.y) * (WStack_128.y - WStack_168.y) +
                        (WStack_128.x - WStack_168.x) * (WStack_128.x - WStack_168.x)) * this->alpha
               + 0.5);
          WSNNode::~WSNNode(&WStack_168);
          WSNNode::~WSNNode(&WStack_128);
        }
        else {
          iVar21 = WSNNode::layer(this->node + *piVar30);
          uVar6 = auStack_728._8_8_;
          if (iVar21 == 1) {
            dVar4 = this->alpha;
            WStack_488._16_8_ = *(undefined8 *)(auStack_728._8_8_ + 0x10);
            WStack_488._0_8_ = *(undefined8 *)auStack_728._8_8_;
            WStack_488.energy = *(double *)(auStack_728._8_8_ + 8);
            WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                 (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                 (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                 (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
            WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                 (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
            uStack_4b8._0_4_ = this->LayerLeaderNode[0].leaderID;
            uStack_4b8._4_4_ = this->LayerLeaderNode[0].id;
            dVar5 = *(double *)pWVar31;
            dStack_4c0 = this->LayerLeaderNode[0].energy;
            dStack_4b0 = *(double *)pWStack_6b8;
            dStack_4a8 = pWStack_6b8->energy;
            dStack_4a0 = *(double *)&pWStack_6b8->leaderID;
            dStack_498 = (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
            iVar26 = WStack_488.x;
            iVar20 = WStack_488.y;
            uStack_4c8._0_4_ = SUB84(dVar5,0);
            iVar21 = (int)uStack_4c8;
            uStack_4c8._4_4_ = (int)((ulong)dVar5 >> 0x20);
            iVar22 = uStack_4c8._4_4_;
            uStack_4c8 = dVar5;
            iVar23 = WSNNode::GetNodeID((WSNNode *)auStack_728._8_8_);
            this->node[iVar23].energy =
                 this->node[iVar23].energy -
                 (dVar4 * (double)((iVar26 - iVar21) * (iVar26 - iVar21) +
                                  (iVar20 - iVar22) * (iVar20 - iVar22)) + 1.0);
            WSNNode::~WSNNode((WSNNode *)&uStack_4c8);
            WSNNode::~WSNNode(&WStack_488);
            iVar21 = *piVar30;
            WStack_1a8.leaderID = this->node[iVar21].leaderID;
            WStack_1a8.id = this->node[iVar21].id;
            pWVar1 = this->node + iVar21;
            WStack_1a8.x = pWVar1->x;
            WStack_1a8.y = pWVar1->y;
            WStack_1a8.energy = pWVar1->energy;
            pSVar2 = &this->node[iVar21].color;
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                 (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                 (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
            uStack_1d8 = *(undefined8 *)(uVar6 + 0x10);
            dVar4 = *(double *)uVar6;
            dStack_1e0 = *(double *)(uVar6 + 8);
            dStack_1d0 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            dStack_1c8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            dStack_1c0 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
            dStack_1b8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
            uStack_1e8._0_4_ = SUB84(dVar4,0);
            uStack_1e8._4_4_ = (int)((ulong)dVar4 >> 0x20);
            this->node[iVar21].energy =
                 this->node[iVar21].energy -
                 ((double)((WStack_1a8.y - uStack_1e8._4_4_) * (WStack_1a8.y - uStack_1e8._4_4_) +
                          (WStack_1a8.x - (int)uStack_1e8) * (WStack_1a8.x - (int)uStack_1e8)) *
                  this->alpha + 0.5);
            uStack_1e8 = dVar4;
            WSNNode::~WSNNode((WSNNode *)&uStack_1e8);
            WSNNode::~WSNNode(&WStack_1a8);
            iVar21 = WSNNode::GetNodeID(pWVar31);
          }
          else {
            iVar21 = WSNNode::layer(this->node + *piVar30);
            if (iVar21 == 2) {
              dVar4 = this->alpha;
              WStack_508._16_8_ = *(undefined8 *)(auStack_728._0_8_ + 0x10);
              WStack_508._0_8_ = *(undefined8 *)auStack_728._0_8_;
              WStack_508.energy = *(double *)(auStack_728._0_8_ + 8);
              WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                   (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                   (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              uStack_538 = *(undefined8 *)(auStack_728._8_8_ + 0x10);
              dVar5 = *(double *)auStack_728._8_8_;
              dStack_540 = *(double *)(auStack_728._8_8_ + 8);
              dStack_530 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              dStack_528 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              dStack_520 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              dStack_518 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              iVar26 = WStack_508.x;
              iVar20 = WStack_508.y;
              uStack_548._0_4_ = SUB84(dVar5,0);
              iVar21 = (int)uStack_548;
              uStack_548._4_4_ = (int)((ulong)dVar5 >> 0x20);
              iVar22 = uStack_548._4_4_;
              uStack_548 = dVar5;
              iVar23 = WSNNode::GetNodeID((WSNNode *)auStack_728._0_8_);
              this->node[iVar23].energy =
                   this->node[iVar23].energy -
                   (dVar4 * (double)((iVar26 - iVar21) * (iVar26 - iVar21) +
                                    (iVar20 - iVar22) * (iVar20 - iVar22)) + 1.0);
              WSNNode::~WSNNode((WSNNode *)&uStack_548);
              WSNNode::~WSNNode(&WStack_508);
              iVar21 = *piVar30;
              WStack_228.leaderID = this->node[iVar21].leaderID;
              WStack_228.id = this->node[iVar21].id;
              pWVar1 = this->node + iVar21;
              WStack_228.x = pWVar1->x;
              WStack_228.y = pWVar1->y;
              WStack_228.energy = pWVar1->energy;
              pSVar2 = &this->node[iVar21].color;
              WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val +
                       2;
              WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
              WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
              uStack_258 = *(undefined8 *)(auStack_728._0_8_ + 0x10);
              dVar4 = *(double *)auStack_728._0_8_;
              dStack_260 = *(double *)(auStack_728._0_8_ + 8);
              dStack_250 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              dStack_248 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              dStack_240 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              dStack_238 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              uStack_268._0_4_ = SUB84(dVar4,0);
              uStack_268._4_4_ = (int)((ulong)dVar4 >> 0x20);
              this->node[iVar21].energy =
                   this->node[iVar21].energy -
                   ((double)((WStack_228.y - uStack_268._4_4_) * (WStack_228.y - uStack_268._4_4_) +
                            (WStack_228.x - (int)uStack_268) * (WStack_228.x - (int)uStack_268)) *
                    this->alpha + 0.5);
              uStack_268 = dVar4;
              WSNNode::~WSNNode((WSNNode *)&uStack_268);
              WSNNode::~WSNNode(&WStack_228);
              iVar21 = WSNNode::GetNodeID(pWVar31);
              this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
              iVar21 = WSNNode::GetNodeID((WSNNode *)auStack_728._8_8_);
            }
            else {
              iVar21 = WSNNode::layer(this->node + *piVar30);
              dVar4 = this->alpha;
              if (iVar21 == 3) {
                WStack_588.leaderID = pWStack_6d8->leaderID;
                WStack_588.id = pWStack_6d8->id;
                uVar7._0_4_ = pWStack_6d8->x;
                uVar7._4_4_ = pWStack_6d8->y;
                WStack_588.energy = pWStack_6d8->energy;
                WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                     (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                     (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                     (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                     (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                WStack_5c8._16_8_ = *(undefined8 *)(auStack_728._0_8_ + 0x10);
                WStack_5c8._0_8_ = *(undefined8 *)auStack_728._0_8_;
                WStack_5c8.energy = *(double *)(auStack_728._0_8_ + 8);
                WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                     (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                     (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                     (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                     (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                iVar21 = WStack_5c8.x;
                iVar22 = WStack_5c8.y;
                WStack_588._0_8_ = uVar7;
                iVar26 = WSNNode::GetNodeID(pWStack_6d8);
                this->node[iVar26].energy =
                     this->node[iVar26].energy -
                     (dVar4 * (double)(((int)uVar7 - iVar21) * ((int)uVar7 - iVar21) +
                                      (uVar7._4_4_ - iVar22) * (uVar7._4_4_ - iVar22)) + 1.0);
                WSNNode::~WSNNode(&WStack_5c8);
                WSNNode::~WSNNode(&WStack_588);
                iVar21 = *piVar30;
                WStack_2a8.leaderID = this->node[iVar21].leaderID;
                WStack_2a8.id = this->node[iVar21].id;
                pWVar1 = this->node + iVar21;
                WStack_2a8.x = pWVar1->x;
                WStack_2a8.y = pWVar1->y;
                WStack_2a8.energy = pWVar1->energy;
                pSVar2 = &this->node[iVar21].color;
                WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                     (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                     (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                         + 2;
                WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
                WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
                dStack_2d8 = *(double *)&pWStack_6d8->leaderID;
                dVar4 = *(double *)pWStack_6d8;
                dStack_2e0 = pWStack_6d8->energy;
                dStack_2d0 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                dStack_2c8 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                dStack_2c0 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                dStack_2b8 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                uStack_2e8._0_4_ = SUB84(dVar4,0);
                uStack_2e8._4_4_ = (int)((ulong)dVar4 >> 0x20);
                this->node[iVar21].energy =
                     this->node[iVar21].energy -
                     ((double)((WStack_2a8.y - uStack_2e8._4_4_) * (WStack_2a8.y - uStack_2e8._4_4_)
                              + (WStack_2a8.x - (int)uStack_2e8) * (WStack_2a8.x - (int)uStack_2e8))
                      * this->alpha + 0.5);
                uStack_2e8 = dVar4;
                WSNNode::~WSNNode((WSNNode *)&uStack_2e8);
                WSNNode::~WSNNode(&WStack_2a8);
                iVar21 = WSNNode::GetNodeID(pWVar31);
                this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
                iVar21 = WSNNode::GetNodeID((WSNNode *)auStack_728._8_8_);
                this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
                iVar21 = WSNNode::GetNodeID((WSNNode *)auStack_728._0_8_);
              }
              else {
                WStack_608.leaderID = pWStack_6a8->leaderID;
                WStack_608.id = pWStack_6a8->id;
                uVar8._0_4_ = pWStack_6a8->x;
                uVar8._4_4_ = pWStack_6a8->y;
                WStack_608.energy = pWStack_6a8->energy;
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                     (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                     (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                     (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                     (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                uStack_638._0_4_ = pWStack_6d8->leaderID;
                uStack_638._4_4_ = pWStack_6d8->id;
                dVar5 = *(double *)pWStack_6d8;
                dStack_640 = pWStack_6d8->energy;
                dStack_630 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                dStack_628 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                dStack_620 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                dStack_618 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                uStack_648._0_4_ = SUB84(dVar5,0);
                iVar21 = (int)uStack_648;
                uStack_648._4_4_ = (int)((ulong)dVar5 >> 0x20);
                iVar22 = uStack_648._4_4_;
                uStack_648 = dVar5;
                WStack_608._0_8_ = uVar8;
                iVar26 = WSNNode::GetNodeID(pWStack_6a8);
                this->node[iVar26].energy =
                     this->node[iVar26].energy -
                     (dVar4 * (double)(((int)uVar8 - iVar21) * ((int)uVar8 - iVar21) +
                                      (uVar8._4_4_ - iVar22) * (uVar8._4_4_ - iVar22)) + 1.0);
                WSNNode::~WSNNode((WSNNode *)&uStack_648);
                WSNNode::~WSNNode(&WStack_608);
                iVar21 = *piVar30;
                WStack_328.leaderID = this->node[iVar21].leaderID;
                WStack_328.id = this->node[iVar21].id;
                pWVar1 = this->node + iVar21;
                WStack_328.x = pWVar1->x;
                WStack_328.y = pWVar1->y;
                WStack_328.energy = pWVar1->energy;
                pSVar2 = &this->node[iVar21].color;
                WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                     (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                     (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                         + 2;
                WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
                WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
                uStack_358._0_4_ = pWStack_6a8->leaderID;
                uStack_358._4_4_ = pWStack_6a8->id;
                dVar4 = *(double *)pWStack_6a8;
                dStack_360 = pWStack_6a8->energy;
                dStack_350 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                dStack_348 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                dStack_340 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                dStack_338 = (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                uStack_368._0_4_ = SUB84(dVar4,0);
                uStack_368._4_4_ = (int)((ulong)dVar4 >> 0x20);
                this->node[iVar21].energy =
                     this->node[iVar21].energy -
                     ((double)((WStack_328.y - uStack_368._4_4_) * (WStack_328.y - uStack_368._4_4_)
                              + (WStack_328.x - (int)uStack_368) * (WStack_328.x - (int)uStack_368))
                      * this->alpha + 0.5);
                uStack_368 = dVar4;
                WSNNode::~WSNNode((WSNNode *)&uStack_368);
                WSNNode::~WSNNode(&WStack_328);
                iVar21 = WSNNode::GetNodeID(pWVar31);
                this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
                iVar21 = WSNNode::GetNodeID((WSNNode *)auStack_728._8_8_);
                this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
                iVar21 = WSNNode::GetNodeID((WSNNode *)auStack_728._0_8_);
                this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
                iVar21 = WSNNode::GetNodeID(pWStack_6d8);
              }
            }
          }
          this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
        }
        iVar21 = *piVar30;
        WStack_a8.leaderID = this->node[iVar21].leaderID;
        WStack_a8.id = this->node[iVar21].id;
        pWVar1 = this->node + iVar21;
        WStack_a8.x = pWVar1->x;
        WStack_a8.y = pWVar1->y;
        WStack_a8.energy = pWVar1->energy;
        pSVar2 = &this->node[iVar21].color;
        WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
        WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
        pWVar29 = (WSNTopologyBasedEnergy *)(auStack_70 + 0x20);
        pWVar28 = pWVar29;
        WSNNode::NodeColor((Scalar *)pWVar29,this->node + iVar21);
        drawCrossNode(pWVar28,&this->img,&WStack_a8,(Scalar *)pWVar29);
        WSNNode::~WSNNode(&WStack_a8);
        _Stack_718._0_8_ = &_Stack_718.sz;
        std::__cxx11::string::_M_construct<char_const*>((string *)&_Stack_718,"WSN","");
        uStack_6e0 = 0;
        auStack_6f8._8_4_ = 0x1010000;
        SStack_6e8 = (Size)this;
        cv::imshow((string *)&_Stack_718,(_InputArray *)(auStack_6f8 + 8));
        if ((Size *)_Stack_718._0_8_ != &_Stack_718.sz) {
          operator_delete((void *)_Stack_718._0_8_,(ulong)((long)_Stack_718.sz + 1));
        }
        cv::Mat::~Mat((Mat *)apdStack_3c8);
        piVar30 = piVar30 + 1;
      } while (piVar30 !=
               vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    pWVar31 = this->node;
    lVar27 = 100;
    do {
      WStack_e8.leaderID = pWVar31->leaderID;
      WStack_e8.id = pWVar31->id;
      WStack_e8.x = pWVar31->x;
      WStack_e8.y = pWVar31->y;
      WStack_e8.energy = pWVar31->energy;
      WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
      WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
           (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
      WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
           (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
      WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
           (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
      pWVar29 = (WSNTopologyBasedEnergy *)auStack_70;
      WSNNode::NodeColor((Scalar *)auStack_70,pWVar31);
      drawCrossNode(pWVar29,&this->img,&WStack_e8,(Scalar *)auStack_70);
      WSNNode::~WSNNode(&WStack_e8);
      apdStack_3c8[0] = adStack_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)apdStack_3c8,"WSN","");
      _Stack_718.sz.width = 0;
      _Stack_718.sz.height = 0;
      _Stack_718.flags = 0x1010000;
      _Stack_718.obj = this;
      cv::imshow((string *)apdStack_3c8,&_Stack_718);
      if (apdStack_3c8[0] != adStack_3b8) {
        operator_delete(apdStack_3c8[0],(long)adStack_3b8[0] + 1);
      }
      pWVar31 = pWVar31 + 1;
      lVar27 = lVar27 + -1;
    } while (lVar27 != 0);
    if (this->Test != false) {
      cv::waitKey(400);
    }
    if (vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  uVar24 = 0;
  uVar25 = 0;
  iVar22 = iVar21;
  do {
    if (this->Mark[uVar24] < iVar22) {
      uVar25 = uVar24 & 0xffffffff;
      iVar22 = this->Mark[uVar24];
    }
    uVar24 = uVar24 + 1;
  } while (uVar24 != 5);
  if ((int)uVar25 == 1) {
    SelectServalNode(&vStack_678,this);
    if (vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pWStack_6a8 = this->LayerLeaderNode;
      pWVar31 = this->LayerLeaderNode + 1;
      pWStack_6b8 = this->LayerLeaderNode + 4;
      pSStack_6c0 = &this->LayerLeaderNode[4].color;
      _Stack_718.sz = (Size)(this->LayerLeaderNode + 3);
      pSStack_6d0 = &this->LayerLeaderNode[3].color;
      auStack_728._0_8_ = this->LayerLeaderNode + 2;
      iStack_658 = 0;
      iStack_654 = 0;
      uStack_650 = 0;
      uStack_64c = 0x406fe000;
      pSStack_6c8 = &this->LayerLeaderNode[2].color;
      pWStack_700 = (WSNNode *)&this->LayerLeaderNode[1].color;
      pWStack_698 = &this->sink;
      pSStack_6a0 = &(this->sink).color;
      pSStack_6b0 = &this->LayerLeaderNode[0].color;
      piVar30 = vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        cv::Mat::clone();
        SelectLeaderID(this);
        _Stack_718.obj = (void *)0x0;
        auStack_728._8_4_ = 0x3010000;
        uStack_660 = 0;
        dStack_680 = *(double *)pWVar31;
        auStack_6f8._0_8_ = 0x4046800000000000;
        auStack_6f8._8_8_ = (void *)0x4062c00000000000;
        SStack_6e8.width = 0;
        SStack_6e8.height = 0x40468000;
        uStack_6e0 = 0;
        _Stack_718._0_8_ = apdStack_3c8;
        cv::line(auStack_728 + 8,&uStack_660,&dStack_680,(string *)auStack_6f8,1,8,0);
        lVar27 = 0x18e8;
        do {
          _Stack_718.obj = (void *)0x0;
          auStack_728._8_4_ = 0x3010000;
          dStack_688 = *(double *)((long)(&(this->sink).color + -4) + lVar27);
          uStack_690 = *(undefined8 *)
                        ((long)(this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                        + lVar27 + -0x48);
          auStack_6f8._4_4_ = iStack_654;
          auStack_6f8._0_4_ = iStack_658;
          auStack_6f8._8_8_ = CONCAT44(uStack_64c,uStack_650);
          SStack_6e8.width = 0;
          SStack_6e8.height = 0;
          uStack_6e0 = 0;
          _Stack_718._0_8_ = apdStack_3c8;
          cv::line(auStack_728 + 8,&dStack_688,&uStack_690,(string *)auStack_6f8,1,8,0);
          auStack_6f8._0_8_ = &SStack_6e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)auStack_6f8,"WSN","");
          _Stack_718.obj = (void *)0x0;
          auStack_728._8_4_ = 0x1010000;
          _Stack_718._0_8_ = apdStack_3c8;
          cv::imshow((string *)auStack_6f8,(_InputArray *)(auStack_728 + 8));
          if ((Size *)auStack_6f8._0_8_ != &SStack_6e8) {
            operator_delete((void *)auStack_6f8._0_8_,(ulong)((long)SStack_6e8 + 1));
          }
          lVar27 = lVar27 + 0x38;
        } while (lVar27 != 0x19c8);
        if (this->Test != false) {
          cv::waitKey(100);
        }
        iVar21 = WSNNode::layer(this->node + *piVar30);
        if (iVar21 == 0) {
          dVar4 = this->alpha;
          WStack_408.leaderID = pWStack_6a8->leaderID;
          WStack_408.id = pWStack_6a8->id;
          uVar10._0_4_ = pWStack_6a8->x;
          uVar10._4_4_ = pWStack_6a8->y;
          WStack_408.energy = pWStack_6a8->energy;
          WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_438._0_4_ = this->LayerLeaderNode[1].leaderID;
          uStack_438._4_4_ = this->LayerLeaderNode[1].id;
          dVar5 = *(double *)pWVar31;
          dStack_440 = this->LayerLeaderNode[1].energy;
          dStack_430 = *(double *)pWStack_700;
          dStack_428 = pWStack_700->energy;
          dStack_420 = *(double *)&pWStack_700->leaderID;
          dStack_418 = (pWStack_700->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          uStack_448._4_4_ = (int)((ulong)dVar5 >> 0x20);
          iVar21 = uStack_448._4_4_;
          uStack_448 = dVar5;
          WStack_408._0_8_ = uVar10;
          iVar22 = WSNNode::GetNodeID(pWStack_6a8);
          iVar26 = (int)uVar10 - SUB84(dVar5,0);
          this->node[iVar22].energy =
               this->node[iVar22].energy -
               (dVar4 * (double)(iVar26 * iVar26 + (uVar10._4_4_ - iVar21) * (uVar10._4_4_ - iVar21)
                                ) + 1.0);
          WSNNode::~WSNNode((WSNNode *)&uStack_448);
          WSNNode::~WSNNode(&WStack_408);
          iVar21 = *piVar30;
          WStack_128.leaderID = this->node[iVar21].leaderID;
          WStack_128.id = this->node[iVar21].id;
          pWVar1 = this->node + iVar21;
          WStack_128.x = pWVar1->x;
          WStack_128.y = pWVar1->y;
          WStack_128.energy = pWVar1->energy;
          pSVar2 = &this->node[iVar21].color;
          WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
          WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
          WStack_168.leaderID = pWStack_6a8->leaderID;
          WStack_168.id = pWStack_6a8->id;
          WStack_168.x = pWStack_6a8->x;
          WStack_168.y = pWStack_6a8->y;
          WStack_168.energy = pWStack_6a8->energy;
          WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          this->node[iVar21].energy =
               this->node[iVar21].energy -
               ((double)((WStack_128.y - WStack_168.y) * (WStack_128.y - WStack_168.y) +
                        (WStack_128.x - WStack_168.x) * (WStack_128.x - WStack_168.x)) * this->alpha
               + 0.5);
          WSNNode::~WSNNode(&WStack_168);
          WSNNode::~WSNNode(&WStack_128);
          iVar21 = WSNNode::GetNodeID(pWVar31);
LAB_00107d97:
          this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
        }
        else {
          iVar21 = WSNNode::layer(this->node + *piVar30);
          if (iVar21 != 1) {
            iVar21 = WSNNode::layer(this->node + *piVar30);
            if (iVar21 == 2) {
              dVar4 = this->alpha;
              WStack_508._16_8_ = *(undefined8 *)(auStack_728._0_8_ + 0x10);
              WStack_508._0_8_ = *(undefined8 *)auStack_728._0_8_;
              WStack_508.energy = *(double *)(auStack_728._0_8_ + 8);
              WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                   (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                   (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              uStack_538._0_4_ = this->LayerLeaderNode[1].leaderID;
              uStack_538._4_4_ = this->LayerLeaderNode[1].id;
              dVar5 = *(double *)pWVar31;
              dStack_540 = this->LayerLeaderNode[1].energy;
              dStack_530 = *(double *)pWStack_700;
              dStack_528 = pWStack_700->energy;
              dStack_520 = *(double *)&pWStack_700->leaderID;
              dStack_518 = (pWStack_700->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0]
              ;
              iVar20 = WStack_508.x;
              iVar21 = WStack_508.y;
              uStack_548._0_4_ = SUB84(dVar5,0);
              iVar22 = (int)uStack_548;
              uStack_548._4_4_ = (int)((ulong)dVar5 >> 0x20);
              iVar26 = uStack_548._4_4_;
              uStack_548 = dVar5;
              iVar23 = WSNNode::GetNodeID((WSNNode *)auStack_728._0_8_);
              iVar21 = iVar21 - iVar26;
              this->node[iVar23].energy =
                   this->node[iVar23].energy -
                   (dVar4 * (double)((iVar20 - iVar22) * (iVar20 - iVar22) + iVar21 * iVar21) + 1.0)
              ;
              WSNNode::~WSNNode((WSNNode *)&uStack_548);
              WSNNode::~WSNNode(&WStack_508);
              iVar21 = *piVar30;
              WStack_228.leaderID = this->node[iVar21].leaderID;
              WStack_228.id = this->node[iVar21].id;
              pWVar1 = this->node + iVar21;
              WStack_228.x = pWVar1->x;
              WStack_228.y = pWVar1->y;
              WStack_228.energy = pWVar1->energy;
              pSVar2 = &this->node[iVar21].color;
              WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val +
                       2;
              WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
              WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
              uStack_258 = *(undefined8 *)(auStack_728._0_8_ + 0x10);
              dVar4 = *(double *)auStack_728._0_8_;
              dStack_260 = *(double *)(auStack_728._0_8_ + 8);
              dStack_250 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              dStack_248 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              dStack_240 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              dStack_238 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              uStack_268._0_4_ = SUB84(dVar4,0);
              uStack_268._4_4_ = (int)((ulong)dVar4 >> 0x20);
              this->node[iVar21].energy =
                   this->node[iVar21].energy -
                   ((double)((WStack_228.y - uStack_268._4_4_) * (WStack_228.y - uStack_268._4_4_) +
                            (WStack_228.x - (int)uStack_268) * (WStack_228.x - (int)uStack_268)) *
                    this->alpha + 0.5);
              uStack_268 = dVar4;
              WSNNode::~WSNNode((WSNNode *)&uStack_268);
              WSNNode::~WSNNode(&WStack_228);
              iVar21 = WSNNode::GetNodeID(pWVar31);
            }
            else {
              iVar21 = WSNNode::layer(this->node + *piVar30);
              dVar4 = this->alpha;
              if (iVar21 == 3) {
                WStack_588._16_8_ = *(undefined8 *)((long)_Stack_718.sz + 0x10);
                WStack_588._0_8_ = *(undefined8 *)_Stack_718.sz;
                WStack_588.energy = *(double *)((long)_Stack_718.sz + 8);
                WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                     (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                     (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                     (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                     (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                WStack_5c8._16_8_ = *(undefined8 *)(auStack_728._0_8_ + 0x10);
                WStack_5c8._0_8_ = *(undefined8 *)auStack_728._0_8_;
                WStack_5c8.energy = *(double *)(auStack_728._0_8_ + 8);
                WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                     (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                     (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                     (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                     (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                iVar26 = WStack_588.x;
                iVar20 = WStack_588.y;
                iVar21 = WStack_5c8.x;
                iVar22 = WStack_5c8.y;
                iVar23 = WSNNode::GetNodeID((WSNNode *)_Stack_718.sz);
                iVar26 = iVar26 - iVar21;
                this->node[iVar23].energy =
                     this->node[iVar23].energy -
                     (dVar4 * (double)(iVar26 * iVar26 + (iVar20 - iVar22) * (iVar20 - iVar22)) +
                     1.0);
                WSNNode::~WSNNode(&WStack_5c8);
                WSNNode::~WSNNode(&WStack_588);
                iVar21 = *piVar30;
                WStack_2a8.leaderID = this->node[iVar21].leaderID;
                WStack_2a8.id = this->node[iVar21].id;
                pWVar1 = this->node + iVar21;
                WStack_2a8.x = pWVar1->x;
                WStack_2a8.y = pWVar1->y;
                WStack_2a8.energy = pWVar1->energy;
                pSVar2 = &this->node[iVar21].color;
                WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                     (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                     (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                         + 2;
                WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
                WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
                dStack_2d8 = *(double *)((long)_Stack_718.sz + 0x10);
                dVar4 = *(double *)_Stack_718.sz;
                dStack_2e0 = *(double *)((long)_Stack_718.sz + 8);
                dStack_2d0 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                dStack_2c8 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                dStack_2c0 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                dStack_2b8 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                uStack_2e8._0_4_ = SUB84(dVar4,0);
                uStack_2e8._4_4_ = (int)((ulong)dVar4 >> 0x20);
                this->node[iVar21].energy =
                     this->node[iVar21].energy -
                     ((double)((WStack_2a8.y - uStack_2e8._4_4_) * (WStack_2a8.y - uStack_2e8._4_4_)
                              + (WStack_2a8.x - (int)uStack_2e8) * (WStack_2a8.x - (int)uStack_2e8))
                      * this->alpha + 0.5);
                uStack_2e8 = dVar4;
                WSNNode::~WSNNode((WSNNode *)&uStack_2e8);
                WSNNode::~WSNNode(&WStack_2a8);
                iVar21 = WSNNode::GetNodeID(pWVar31);
                this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
                iVar21 = WSNNode::GetNodeID((WSNNode *)auStack_728._0_8_);
              }
              else {
                WStack_608.leaderID = pWStack_6b8->leaderID;
                WStack_608.id = pWStack_6b8->id;
                uVar11._0_4_ = pWStack_6b8->x;
                uVar11._4_4_ = pWStack_6b8->y;
                WStack_608.energy = pWStack_6b8->energy;
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                     (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                     (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                     (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                     (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                uStack_638 = *(undefined8 *)((long)_Stack_718.sz + 0x10);
                dVar5 = *(double *)_Stack_718.sz;
                dStack_640 = *(double *)((long)_Stack_718.sz + 8);
                dStack_630 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                dStack_628 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                dStack_620 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                dStack_618 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                uStack_648._4_4_ = (int)((ulong)dVar5 >> 0x20);
                iVar21 = uStack_648._4_4_;
                uStack_648 = dVar5;
                WStack_608._0_8_ = uVar11;
                iVar22 = WSNNode::GetNodeID(pWStack_6b8);
                iVar26 = (int)uVar11 - SUB84(dVar5,0);
                this->node[iVar22].energy =
                     this->node[iVar22].energy -
                     (dVar4 * (double)(iVar26 * iVar26 +
                                      (uVar11._4_4_ - iVar21) * (uVar11._4_4_ - iVar21)) + 1.0);
                WSNNode::~WSNNode((WSNNode *)&uStack_648);
                WSNNode::~WSNNode(&WStack_608);
                iVar21 = *piVar30;
                WStack_328.leaderID = this->node[iVar21].leaderID;
                WStack_328.id = this->node[iVar21].id;
                pWVar1 = this->node + iVar21;
                WStack_328.x = pWVar1->x;
                WStack_328.y = pWVar1->y;
                WStack_328.energy = pWVar1->energy;
                pSVar2 = &this->node[iVar21].color;
                WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                     (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                     (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                         + 2;
                WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
                WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
                uStack_358._0_4_ = pWStack_6b8->leaderID;
                uStack_358._4_4_ = pWStack_6b8->id;
                dVar4 = *(double *)pWStack_6b8;
                dStack_360 = pWStack_6b8->energy;
                dStack_350 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
                dStack_348 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
                dStack_340 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
                dStack_338 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
                uStack_368._0_4_ = SUB84(dVar4,0);
                uStack_368._4_4_ = (int)((ulong)dVar4 >> 0x20);
                this->node[iVar21].energy =
                     this->node[iVar21].energy -
                     ((double)((WStack_328.y - uStack_368._4_4_) * (WStack_328.y - uStack_368._4_4_)
                              + (WStack_328.x - (int)uStack_368) * (WStack_328.x - (int)uStack_368))
                      * this->alpha + 0.5);
                uStack_368 = dVar4;
                WSNNode::~WSNNode((WSNNode *)&uStack_368);
                WSNNode::~WSNNode(&WStack_328);
                iVar21 = WSNNode::GetNodeID(pWVar31);
                this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
                iVar21 = WSNNode::GetNodeID((WSNNode *)auStack_728._0_8_);
                this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
                iVar21 = WSNNode::GetNodeID((WSNNode *)_Stack_718.sz);
              }
            }
            goto LAB_00107d97;
          }
          dVar4 = this->alpha;
          WStack_488.leaderID = this->LayerLeaderNode[1].leaderID;
          WStack_488.id = this->LayerLeaderNode[1].id;
          uVar9._0_4_ = pWVar31->x;
          uVar9._4_4_ = pWVar31->y;
          WStack_488.energy = this->LayerLeaderNode[1].energy;
          WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               *(double *)pWStack_700;
          WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               pWStack_700->energy;
          WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               *(double *)&pWStack_700->leaderID;
          WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (pWStack_700->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          uStack_4b8._0_4_ = pWStack_698->leaderID;
          uStack_4b8._4_4_ = pWStack_698->id;
          dVar5 = *(double *)pWStack_698;
          dStack_4c0 = pWStack_698->energy;
          dStack_4b0 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_4a8 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_4a0 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_498 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_4c8._4_4_ = (int)((ulong)dVar5 >> 0x20);
          iVar21 = uStack_4c8._4_4_;
          uStack_4c8 = dVar5;
          WStack_488._0_8_ = uVar9;
          iVar22 = WSNNode::GetNodeID(pWVar31);
          iVar26 = (int)uVar9 - SUB84(dVar5,0);
          this->node[iVar22].energy =
               this->node[iVar22].energy -
               (dVar4 * (double)(iVar26 * iVar26 + (uVar9._4_4_ - iVar21) * (uVar9._4_4_ - iVar21))
               + 1.0);
          WSNNode::~WSNNode((WSNNode *)&uStack_4c8);
          WSNNode::~WSNNode(&WStack_488);
          iVar21 = *piVar30;
          WStack_1a8.leaderID = this->node[iVar21].leaderID;
          WStack_1a8.id = this->node[iVar21].id;
          pWVar1 = this->node + iVar21;
          WStack_1a8.x = pWVar1->x;
          WStack_1a8.y = pWVar1->y;
          WStack_1a8.energy = pWVar1->energy;
          pSVar2 = &this->node[iVar21].color;
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
          uStack_1d8._0_4_ = this->LayerLeaderNode[1].leaderID;
          uStack_1d8._4_4_ = this->LayerLeaderNode[1].id;
          dVar4 = *(double *)pWVar31;
          dStack_1e0 = this->LayerLeaderNode[1].energy;
          dStack_1d0 = *(double *)pWStack_700;
          dStack_1c8 = pWStack_700->energy;
          dStack_1c0 = *(double *)&pWStack_700->leaderID;
          dStack_1b8 = (pWStack_700->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
          uStack_1e8._0_4_ = SUB84(dVar4,0);
          uStack_1e8._4_4_ = (int)((ulong)dVar4 >> 0x20);
          this->node[iVar21].energy =
               this->node[iVar21].energy -
               ((double)((WStack_1a8.y - uStack_1e8._4_4_) * (WStack_1a8.y - uStack_1e8._4_4_) +
                        (WStack_1a8.x - (int)uStack_1e8) * (WStack_1a8.x - (int)uStack_1e8)) *
                this->alpha + 0.5);
          uStack_1e8 = dVar4;
          WSNNode::~WSNNode((WSNNode *)&uStack_1e8);
          WSNNode::~WSNNode(&WStack_1a8);
        }
        iVar21 = *piVar30;
        WStack_a8.leaderID = this->node[iVar21].leaderID;
        WStack_a8.id = this->node[iVar21].id;
        pWVar1 = this->node + iVar21;
        WStack_a8.x = pWVar1->x;
        WStack_a8.y = pWVar1->y;
        WStack_a8.energy = pWVar1->energy;
        pSVar2 = &this->node[iVar21].color;
        WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
        WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
        pWVar29 = (WSNTopologyBasedEnergy *)(auStack_70 + 0x20);
        pWVar28 = pWVar29;
        WSNNode::NodeColor((Scalar *)pWVar29,this->node + iVar21);
        drawCrossNode(pWVar28,&this->img,&WStack_a8,(Scalar *)pWVar29);
        WSNNode::~WSNNode(&WStack_a8);
        auStack_6f8._0_8_ = &SStack_6e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)auStack_6f8,"WSN","");
        _Stack_718.obj = (WSNTopologyBasedEnergy *)0x0;
        auStack_728._8_4_ = 0x1010000;
        _Stack_718._0_8_ = this;
        cv::imshow((string *)auStack_6f8,(_InputArray *)(auStack_728 + 8));
        if ((Size *)auStack_6f8._0_8_ != &SStack_6e8) {
          operator_delete((void *)auStack_6f8._0_8_,(ulong)((long)SStack_6e8 + 1));
        }
        cv::Mat::~Mat((Mat *)apdStack_3c8);
        piVar30 = piVar30 + 1;
      } while (piVar30 !=
               vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    pWVar31 = this->node;
    lVar27 = 100;
    do {
      WStack_e8.leaderID = pWVar31->leaderID;
      WStack_e8.id = pWVar31->id;
      WStack_e8.x = pWVar31->x;
      WStack_e8.y = pWVar31->y;
      WStack_e8.energy = pWVar31->energy;
      WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
      WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
           (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
      WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
           (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
      WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
           (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
      pWVar29 = (WSNTopologyBasedEnergy *)auStack_70;
      WSNNode::NodeColor((Scalar *)auStack_70,pWVar31);
      drawCrossNode(pWVar29,&this->img,&WStack_e8,(Scalar *)auStack_70);
      WSNNode::~WSNNode(&WStack_e8);
      apdStack_3c8[0] = adStack_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)apdStack_3c8,"WSN","");
      SStack_6e8.width = 0;
      SStack_6e8.height = 0;
      auStack_6f8._0_4_ = 0x1010000;
      auStack_6f8._8_8_ = this;
      cv::imshow((string *)apdStack_3c8,(_InputArray *)auStack_6f8);
      if (apdStack_3c8[0] != adStack_3b8) {
        operator_delete(apdStack_3c8[0],(long)adStack_3b8[0] + 1);
      }
      pWVar31 = pWVar31 + 1;
      lVar27 = lVar27 + -1;
    } while (lVar27 != 0);
    if (this->Test != false) {
      cv::waitKey(400);
    }
    if (vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  uVar24 = 0;
  uVar25 = 0;
  iVar22 = iVar21;
  do {
    if (this->Mark[uVar24] < iVar22) {
      uVar25 = uVar24 & 0xffffffff;
      iVar22 = this->Mark[uVar24];
    }
    uVar24 = uVar24 + 1;
  } while (uVar24 != 5);
  if ((int)uVar25 == 2) {
    SelectServalNode(&vStack_678,this);
    piStack_740 = vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
    if (vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      pWStack_6a8 = this->LayerLeaderNode;
      pWVar31 = this->LayerLeaderNode + 2;
      pWStack_6b8 = this->LayerLeaderNode + 4;
      pSStack_6c0 = &this->LayerLeaderNode[4].color;
      _Stack_718.obj = this->LayerLeaderNode + 3;
      pSStack_6d0 = &this->LayerLeaderNode[3].color;
      _Stack_718.sz = (Size)&this->LayerLeaderNode[2].color;
      iStack_658 = 0;
      iStack_654 = 0;
      uStack_650 = 0;
      uStack_64c = 0x406fe000;
      pWStack_698 = &this->sink;
      pSStack_6a0 = &(this->sink).color;
      pWStack_700 = this->LayerLeaderNode + 1;
      pSStack_6c8 = &this->LayerLeaderNode[1].color;
      pSStack_6b0 = &this->LayerLeaderNode[0].color;
      do {
        cv::Mat::clone();
        SelectLeaderID(this);
        _Stack_718.flags = 0;
        _Stack_718._4_4_ = 0;
        auStack_728._0_4_ = 0x3010000;
        uStack_660 = 0;
        dStack_680 = *(double *)pWVar31;
        auStack_6f8._0_8_ = 0x4046800000000000;
        auStack_6f8._8_8_ = (void *)0x4062c00000000000;
        SStack_6e8.width = 0;
        SStack_6e8.height = 0x40468000;
        uStack_6e0 = 0;
        auStack_728._8_8_ = (Mat *)apdStack_3c8;
        cv::line(auStack_728,&uStack_660,&dStack_680,(string *)auStack_6f8,1,8,0);
        lVar27 = 0x18e8;
        do {
          _Stack_718.flags = 0;
          _Stack_718._4_4_ = 0;
          auStack_728._0_4_ = 0x3010000;
          dStack_688 = *(double *)((long)(&(this->sink).color + -4) + lVar27);
          uStack_690 = *(undefined8 *)
                        ((long)(this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val
                        + lVar27 + -0x48);
          auStack_6f8._4_4_ = iStack_654;
          auStack_6f8._0_4_ = iStack_658;
          auStack_6f8._8_8_ = CONCAT44(uStack_64c,uStack_650);
          SStack_6e8.width = 0;
          SStack_6e8.height = 0;
          uStack_6e0 = 0;
          auStack_728._8_8_ = (Mat *)apdStack_3c8;
          cv::line(auStack_728,&dStack_688,&uStack_690,(string *)auStack_6f8,1,8,0);
          auStack_6f8._0_8_ = &SStack_6e8;
          std::__cxx11::string::_M_construct<char_const*>((string *)auStack_6f8,"WSN","");
          _Stack_718.flags = 0;
          _Stack_718._4_4_ = 0;
          auStack_728._0_4_ = 0x1010000;
          auStack_728._8_8_ = (Mat *)apdStack_3c8;
          cv::imshow((string *)auStack_6f8,(_InputArray *)auStack_728);
          if ((Size *)auStack_6f8._0_8_ != &SStack_6e8) {
            operator_delete((void *)auStack_6f8._0_8_,(ulong)((long)SStack_6e8 + 1));
          }
          lVar27 = lVar27 + 0x38;
        } while (lVar27 != 0x19c8);
        if (this->Test != false) {
          cv::waitKey(100);
        }
        iVar21 = WSNNode::layer(this->node + *piStack_740);
        if (iVar21 == 0) {
          dVar4 = this->alpha;
          WStack_408.leaderID = pWStack_6a8->leaderID;
          WStack_408.id = pWStack_6a8->id;
          uVar13._0_4_ = pWStack_6a8->x;
          uVar13._4_4_ = pWStack_6a8->y;
          WStack_408.energy = pWStack_6a8->energy;
          WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_438._0_4_ = pWStack_700->leaderID;
          uStack_438._4_4_ = pWStack_700->id;
          dVar5 = *(double *)pWStack_700;
          dStack_440 = pWStack_700->energy;
          dStack_430 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_428 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_420 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_418 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_448._4_4_ = (int)((ulong)dVar5 >> 0x20);
          iVar21 = uStack_448._4_4_;
          uStack_448 = dVar5;
          WStack_408._0_8_ = uVar13;
          iVar22 = WSNNode::GetNodeID(pWStack_6a8);
          iVar26 = (int)uVar13 - SUB84(dVar5,0);
          this->node[iVar22].energy =
               this->node[iVar22].energy -
               (dVar4 * (double)(iVar26 * iVar26 + (uVar13._4_4_ - iVar21) * (uVar13._4_4_ - iVar21)
                                ) + 1.0);
          WSNNode::~WSNNode((WSNNode *)&uStack_448);
          WSNNode::~WSNNode(&WStack_408);
          iVar21 = *piStack_740;
          WStack_128.leaderID = this->node[iVar21].leaderID;
          WStack_128.id = this->node[iVar21].id;
          pWVar1 = this->node + iVar21;
          WStack_128.x = pWVar1->x;
          WStack_128.y = pWVar1->y;
          WStack_128.energy = pWVar1->energy;
          pSVar2 = &this->node[iVar21].color;
          WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
          WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
          WStack_168.leaderID = pWStack_6a8->leaderID;
          WStack_168.id = pWStack_6a8->id;
          WStack_168.x = pWStack_6a8->x;
          WStack_168.y = pWStack_6a8->y;
          WStack_168.energy = pWStack_6a8->energy;
          WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          this->node[iVar21].energy =
               this->node[iVar21].energy -
               ((double)((WStack_128.y - WStack_168.y) * (WStack_128.y - WStack_168.y) +
                        (WStack_128.x - WStack_168.x) * (WStack_128.x - WStack_168.x)) * this->alpha
               + 0.5);
          WSNNode::~WSNNode(&WStack_168);
          WSNNode::~WSNNode(&WStack_128);
          iVar21 = WSNNode::GetNodeID(pWStack_700);
          this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
          iVar21 = WSNNode::GetNodeID(pWVar31);
LAB_00108828:
          this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
        }
        else {
          iVar21 = WSNNode::layer(this->node + *piStack_740);
          if (iVar21 == 1) {
            dVar4 = this->alpha;
            WStack_488.leaderID = pWStack_700->leaderID;
            WStack_488.id = pWStack_700->id;
            uVar12._0_4_ = pWStack_700->x;
            uVar12._4_4_ = pWStack_700->y;
            WStack_488.energy = pWStack_700->energy;
            WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                 (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                 (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                 (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
            WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                 (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
            uStack_4b8._0_4_ = this->LayerLeaderNode[2].leaderID;
            uStack_4b8._4_4_ = this->LayerLeaderNode[2].id;
            dVar5 = *(double *)pWVar31;
            dStack_4c0 = this->LayerLeaderNode[2].energy;
            dStack_4b0 = *(double *)_Stack_718.sz;
            dStack_4a8 = *(double *)((long)_Stack_718.sz + 8);
            dStack_4a0 = *(double *)((long)_Stack_718.sz + 0x10);
            dStack_498 = (((Scalar *)((long)_Stack_718.sz + 0x18))->super_Vec<double,_4>).
                         super_Matx<double,_4,_1>.val[0];
            uStack_4c8._4_4_ = (int)((ulong)dVar5 >> 0x20);
            iVar21 = uStack_4c8._4_4_;
            uStack_4c8 = dVar5;
            WStack_488._0_8_ = uVar12;
            iVar22 = WSNNode::GetNodeID(pWStack_700);
            iVar26 = (int)uVar12 - SUB84(dVar5,0);
            this->node[iVar22].energy =
                 this->node[iVar22].energy -
                 (dVar4 * (double)(iVar26 * iVar26 +
                                  (uVar12._4_4_ - iVar21) * (uVar12._4_4_ - iVar21)) + 1.0);
            WSNNode::~WSNNode((WSNNode *)&uStack_4c8);
            WSNNode::~WSNNode(&WStack_488);
            iVar21 = *piStack_740;
            WStack_1a8.leaderID = this->node[iVar21].leaderID;
            WStack_1a8.id = this->node[iVar21].id;
            pWVar1 = this->node + iVar21;
            WStack_1a8.x = pWVar1->x;
            WStack_1a8.y = pWVar1->y;
            WStack_1a8.energy = pWVar1->energy;
            pSVar2 = &this->node[iVar21].color;
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                 (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                 (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
            WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
            uStack_1d8._0_4_ = pWStack_700->leaderID;
            uStack_1d8._4_4_ = pWStack_700->id;
            dVar4 = *(double *)pWStack_700;
            dStack_1e0 = pWStack_700->energy;
            dStack_1d0 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
            dStack_1c8 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
            dStack_1c0 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
            dStack_1b8 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
            uStack_1e8._0_4_ = SUB84(dVar4,0);
            uStack_1e8._4_4_ = (int)((ulong)dVar4 >> 0x20);
            this->node[iVar21].energy =
                 this->node[iVar21].energy -
                 ((double)((WStack_1a8.y - uStack_1e8._4_4_) * (WStack_1a8.y - uStack_1e8._4_4_) +
                          (WStack_1a8.x - (int)uStack_1e8) * (WStack_1a8.x - (int)uStack_1e8)) *
                  this->alpha + 0.5);
            uStack_1e8 = dVar4;
            WSNNode::~WSNNode((WSNNode *)&uStack_1e8);
            WSNNode::~WSNNode(&WStack_1a8);
            iVar21 = WSNNode::GetNodeID(pWVar31);
            goto LAB_00108828;
          }
          iVar21 = WSNNode::layer(this->node + *piStack_740);
          if (iVar21 != 2) {
            iVar21 = WSNNode::layer(this->node + *piStack_740);
            dVar4 = this->alpha;
            if (iVar21 == 3) {
              WStack_588._16_8_ = *(undefined8 *)((long)_Stack_718.obj + 0x10);
              WStack_588._0_8_ = *_Stack_718.obj;
              WStack_588.energy = *(double *)((long)_Stack_718.obj + 8);
              WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                   (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                   (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              WStack_5c8.leaderID = this->LayerLeaderNode[2].leaderID;
              WStack_5c8.id = this->LayerLeaderNode[2].id;
              uVar15._0_4_ = pWVar31->x;
              uVar15._4_4_ = pWVar31->y;
              WStack_5c8.energy = this->LayerLeaderNode[2].energy;
              WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   *(double *)_Stack_718.sz;
              WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   *(double *)((long)_Stack_718.sz + 8);
              WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                   *(double *)((long)_Stack_718.sz + 0x10);
              WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                   (((Scalar *)((long)_Stack_718.sz + 0x18))->super_Vec<double,_4>).
                   super_Matx<double,_4,_1>.val[0];
              iVar22 = WStack_588.x;
              iVar21 = WStack_588.y;
              WStack_5c8._0_8_ = uVar15;
              iVar26 = WSNNode::GetNodeID((WSNNode *)_Stack_718.obj);
              iVar21 = iVar21 - uVar15._4_4_;
              this->node[iVar26].energy =
                   this->node[iVar26].energy -
                   (dVar4 * (double)((iVar22 - (int)uVar15) * (iVar22 - (int)uVar15) +
                                    iVar21 * iVar21) + 1.0);
              WSNNode::~WSNNode(&WStack_5c8);
              WSNNode::~WSNNode(&WStack_588);
              iVar21 = *piStack_740;
              WStack_2a8.leaderID = this->node[iVar21].leaderID;
              WStack_2a8.id = this->node[iVar21].id;
              pWVar1 = this->node + iVar21;
              WStack_2a8.x = pWVar1->x;
              WStack_2a8.y = pWVar1->y;
              WStack_2a8.energy = pWVar1->energy;
              pSVar2 = &this->node[iVar21].color;
              WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val +
                       2;
              WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
              WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
              dStack_2d8 = *(double *)((long)_Stack_718.obj + 0x10);
              dVar4 = *_Stack_718.obj;
              dStack_2e0 = *(double *)((long)_Stack_718.obj + 8);
              dStack_2d0 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              dStack_2c8 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              dStack_2c0 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              dStack_2b8 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              uStack_2e8._0_4_ = SUB84(dVar4,0);
              uStack_2e8._4_4_ = (int)((ulong)dVar4 >> 0x20);
              this->node[iVar21].energy =
                   this->node[iVar21].energy -
                   ((double)((WStack_2a8.y - uStack_2e8._4_4_) * (WStack_2a8.y - uStack_2e8._4_4_) +
                            (WStack_2a8.x - (int)uStack_2e8) * (WStack_2a8.x - (int)uStack_2e8)) *
                    this->alpha + 0.5);
              uStack_2e8 = dVar4;
              WSNNode::~WSNNode((WSNNode *)&uStack_2e8);
              WSNNode::~WSNNode(&WStack_2a8);
              iVar21 = WSNNode::GetNodeID(pWVar31);
            }
            else {
              WStack_608.leaderID = pWStack_6b8->leaderID;
              WStack_608.id = pWStack_6b8->id;
              uVar16._0_4_ = pWStack_6b8->x;
              uVar16._4_4_ = pWStack_6b8->y;
              WStack_608.energy = pWStack_6b8->energy;
              WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
                   (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
                   (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              uStack_638 = *(undefined8 *)((long)_Stack_718.obj + 0x10);
              dVar5 = *_Stack_718.obj;
              dStack_640 = *(double *)((long)_Stack_718.obj + 8);
              dStack_630 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              dStack_628 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              dStack_620 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              dStack_618 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              uStack_648._0_4_ = SUB84(dVar5,0);
              iVar21 = (int)uStack_648;
              uStack_648._4_4_ = (int)((ulong)dVar5 >> 0x20);
              iVar22 = uStack_648._4_4_;
              uStack_648 = dVar5;
              WStack_608._0_8_ = uVar16;
              iVar26 = WSNNode::GetNodeID(pWStack_6b8);
              this->node[iVar26].energy =
                   this->node[iVar26].energy -
                   (dVar4 * (double)(((int)uVar16 - iVar21) * ((int)uVar16 - iVar21) +
                                    (uVar16._4_4_ - iVar22) * (uVar16._4_4_ - iVar22)) + 1.0);
              WSNNode::~WSNNode((WSNNode *)&uStack_648);
              WSNNode::~WSNNode(&WStack_608);
              iVar21 = *piStack_740;
              WStack_328.leaderID = this->node[iVar21].leaderID;
              WStack_328.id = this->node[iVar21].id;
              pWVar1 = this->node + iVar21;
              WStack_328.x = pWVar1->x;
              WStack_328.y = pWVar1->y;
              WStack_328.energy = pWVar1->energy;
              pSVar2 = &this->node[iVar21].color;
              WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
                   (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
                   (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val +
                       2;
              WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
              WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
              uStack_358._0_4_ = pWStack_6b8->leaderID;
              uStack_358._4_4_ = pWStack_6b8->id;
              dVar4 = *(double *)pWStack_6b8;
              dStack_360 = pWStack_6b8->energy;
              dStack_350 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
              dStack_348 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
              dStack_340 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
              dStack_338 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
              uStack_368._0_4_ = SUB84(dVar4,0);
              uStack_368._4_4_ = (int)((ulong)dVar4 >> 0x20);
              this->node[iVar21].energy =
                   this->node[iVar21].energy -
                   ((double)((WStack_328.y - uStack_368._4_4_) * (WStack_328.y - uStack_368._4_4_) +
                            (WStack_328.x - (int)uStack_368) * (WStack_328.x - (int)uStack_368)) *
                    this->alpha + 0.5);
              uStack_368 = dVar4;
              WSNNode::~WSNNode((WSNNode *)&uStack_368);
              WSNNode::~WSNNode(&WStack_328);
              iVar21 = WSNNode::GetNodeID(pWVar31);
              this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
              iVar21 = WSNNode::GetNodeID((WSNNode *)_Stack_718.obj);
            }
            goto LAB_00108828;
          }
          dVar4 = this->alpha;
          WStack_508.leaderID = this->LayerLeaderNode[2].leaderID;
          WStack_508.id = this->LayerLeaderNode[2].id;
          uVar14._0_4_ = pWVar31->x;
          uVar14._4_4_ = pWVar31->y;
          WStack_508.energy = this->LayerLeaderNode[2].energy;
          WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               *(double *)_Stack_718.sz;
          WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               *(double *)((long)_Stack_718.sz + 8);
          WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               *(double *)((long)_Stack_718.sz + 0x10);
          WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (((Scalar *)((long)_Stack_718.sz + 0x18))->super_Vec<double,_4>).
               super_Matx<double,_4,_1>.val[0];
          uStack_538._0_4_ = pWStack_698->leaderID;
          uStack_538._4_4_ = pWStack_698->id;
          dVar5 = *(double *)pWStack_698;
          dStack_540 = pWStack_698->energy;
          dStack_530 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_528 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_520 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_518 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_548._0_4_ = SUB84(dVar5,0);
          iVar21 = (int)uStack_548;
          uStack_548._4_4_ = (int)((ulong)dVar5 >> 0x20);
          iVar22 = uStack_548._4_4_;
          uStack_548 = dVar5;
          WStack_508._0_8_ = uVar14;
          iVar26 = WSNNode::GetNodeID(pWVar31);
          this->node[iVar26].energy =
               this->node[iVar26].energy -
               (dVar4 * (double)(((int)uVar14 - iVar21) * ((int)uVar14 - iVar21) +
                                (uVar14._4_4_ - iVar22) * (uVar14._4_4_ - iVar22)) + 1.0);
          WSNNode::~WSNNode((WSNNode *)&uStack_548);
          WSNNode::~WSNNode(&WStack_508);
          iVar21 = *piStack_740;
          WStack_228.leaderID = this->node[iVar21].leaderID;
          WStack_228.id = this->node[iVar21].id;
          pWVar1 = this->node + iVar21;
          WStack_228.x = pWVar1->x;
          WStack_228.y = pWVar1->y;
          WStack_228.energy = pWVar1->energy;
          pSVar2 = &this->node[iVar21].color;
          WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
          WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
          uStack_258._0_4_ = this->LayerLeaderNode[2].leaderID;
          uStack_258._4_4_ = this->LayerLeaderNode[2].id;
          dVar4 = *(double *)pWVar31;
          dStack_260 = this->LayerLeaderNode[2].energy;
          dStack_250 = *(double *)_Stack_718.sz;
          dStack_248 = *(double *)((long)_Stack_718.sz + 8);
          dStack_240 = *(double *)((long)_Stack_718.sz + 0x10);
          dStack_238 = (((Scalar *)((long)_Stack_718.sz + 0x18))->super_Vec<double,_4>).
                       super_Matx<double,_4,_1>.val[0];
          uStack_268._0_4_ = SUB84(dVar4,0);
          uStack_268._4_4_ = (int)((ulong)dVar4 >> 0x20);
          this->node[iVar21].energy =
               this->node[iVar21].energy -
               ((double)((WStack_228.y - uStack_268._4_4_) * (WStack_228.y - uStack_268._4_4_) +
                        (WStack_228.x - (int)uStack_268) * (WStack_228.x - (int)uStack_268)) *
                this->alpha + 0.5);
          uStack_268 = dVar4;
          WSNNode::~WSNNode((WSNNode *)&uStack_268);
          WSNNode::~WSNNode(&WStack_228);
        }
        iVar21 = *piStack_740;
        WStack_a8.leaderID = this->node[iVar21].leaderID;
        WStack_a8.id = this->node[iVar21].id;
        pWVar1 = this->node + iVar21;
        WStack_a8.x = pWVar1->x;
        WStack_a8.y = pWVar1->y;
        WStack_a8.energy = pWVar1->energy;
        pSVar2 = &this->node[iVar21].color;
        WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
        WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
        pWVar29 = (WSNTopologyBasedEnergy *)(auStack_70 + 0x20);
        pWVar28 = pWVar29;
        WSNNode::NodeColor((Scalar *)pWVar29,this->node + iVar21);
        drawCrossNode(pWVar28,&this->img,&WStack_a8,(Scalar *)pWVar29);
        WSNNode::~WSNNode(&WStack_a8);
        auStack_6f8._0_8_ = &SStack_6e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)auStack_6f8,"WSN","");
        _Stack_718.flags = 0;
        _Stack_718._4_4_ = 0;
        auStack_728._0_4_ = 0x1010000;
        auStack_728._8_8_ = this;
        cv::imshow((string *)auStack_6f8,(_InputArray *)auStack_728);
        if ((Size *)auStack_6f8._0_8_ != &SStack_6e8) {
          operator_delete((void *)auStack_6f8._0_8_,(ulong)((long)SStack_6e8 + 1));
        }
        cv::Mat::~Mat((Mat *)apdStack_3c8);
        piStack_740 = piStack_740 + 1;
      } while (piStack_740 !=
               vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    }
    pWVar31 = this->node;
    lVar27 = 100;
    do {
      WStack_e8.leaderID = pWVar31->leaderID;
      WStack_e8.id = pWVar31->id;
      WStack_e8.x = pWVar31->x;
      WStack_e8.y = pWVar31->y;
      WStack_e8.energy = pWVar31->energy;
      WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
      WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
           (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
      WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
           (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
      WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
           (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
      pWVar29 = (WSNTopologyBasedEnergy *)auStack_70;
      WSNNode::NodeColor((Scalar *)auStack_70,pWVar31);
      drawCrossNode(pWVar29,&this->img,&WStack_e8,(Scalar *)auStack_70);
      WSNNode::~WSNNode(&WStack_e8);
      apdStack_3c8[0] = adStack_3b8;
      std::__cxx11::string::_M_construct<char_const*>((string *)apdStack_3c8,"WSN","");
      SStack_6e8.width = 0;
      SStack_6e8.height = 0;
      auStack_6f8._0_4_ = 0x1010000;
      auStack_6f8._8_8_ = this;
      cv::imshow((string *)apdStack_3c8,(_InputArray *)auStack_6f8);
      if (apdStack_3c8[0] != adStack_3b8) {
        operator_delete(apdStack_3c8[0],(long)adStack_3b8[0] + 1);
      }
      pWVar31 = pWVar31 + 1;
      lVar27 = lVar27 + -1;
    } while (lVar27 != 0);
    if (this->Test != false) {
      cv::waitKey(400);
    }
    if (vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (int *)0x0) {
      operator_delete(vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    return;
  }
  uVar24 = 0;
  uVar25 = 0;
  do {
    if (this->Mark[uVar24] < iVar21) {
      uVar25 = uVar24 & 0xffffffff;
      iVar21 = this->Mark[uVar24];
    }
    uVar24 = uVar24 + 1;
  } while (uVar24 != 5);
  if ((int)uVar25 == 3) {
    TopLayer3SentSink(this);
    return;
  }
  SelectServalNode(&vStack_678,this);
  piStack_740 = vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish) {
    pWStack_6a8 = this->LayerLeaderNode;
    pWVar31 = this->LayerLeaderNode + 4;
    pWStack_6b8 = (WSNNode *)&this->LayerLeaderNode[4].color;
    pWStack_698 = &this->sink;
    pSStack_6a0 = &(this->sink).color;
    auStack_728._0_8_ = this->LayerLeaderNode + 3;
    pSStack_6d0 = &this->LayerLeaderNode[3].color;
    iStack_658 = 0;
    iStack_654 = 0;
    uStack_650 = 0;
    uStack_64c = 0x406fe000;
    auStack_728._8_8_ = this->LayerLeaderNode + 2;
    pSStack_6c8 = &this->LayerLeaderNode[2].color;
    pWStack_700 = this->LayerLeaderNode + 1;
    pSStack_6c0 = &this->LayerLeaderNode[1].color;
    pSStack_6b0 = &this->LayerLeaderNode[0].color;
    do {
      cv::Mat::clone();
      SelectLeaderID(this);
      _Stack_718.sz.width = 0;
      _Stack_718.sz.height = 0;
      _Stack_718.flags = 0x3010000;
      uStack_660 = 0;
      dStack_680 = *(double *)pWVar31;
      auStack_6f8._0_8_ = 0x4046800000000000;
      auStack_6f8._8_8_ = (void *)0x4062c00000000000;
      SStack_6e8.width = 0;
      SStack_6e8.height = 0x40468000;
      uStack_6e0 = 0;
      _Stack_718.obj = (Mat *)apdStack_3c8;
      cv::line((Size *)&_Stack_718,&uStack_660,&dStack_680,(string *)auStack_6f8,1,8,0);
      lVar27 = 0x18e8;
      do {
        _Stack_718.sz.width = 0;
        _Stack_718.sz.height = 0;
        _Stack_718.flags = 0x3010000;
        dStack_688 = *(double *)((long)(&(this->sink).color + -4) + lVar27);
        uStack_690 = *(undefined8 *)
                      ((long)(this->sink).color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val +
                      lVar27 + -0x48);
        auStack_6f8._4_4_ = iStack_654;
        auStack_6f8._0_4_ = iStack_658;
        auStack_6f8._8_8_ = CONCAT44(uStack_64c,uStack_650);
        SStack_6e8.width = 0;
        SStack_6e8.height = 0;
        uStack_6e0 = 0;
        _Stack_718.obj = (Mat *)apdStack_3c8;
        cv::line((Size *)&_Stack_718,&dStack_688,&uStack_690,(string *)auStack_6f8,1,8,0);
        auStack_6f8._0_8_ = &SStack_6e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)auStack_6f8,"WSN","");
        _Stack_718.sz.width = 0;
        _Stack_718.sz.height = 0;
        _Stack_718.flags = 0x1010000;
        _Stack_718.obj = (Mat *)apdStack_3c8;
        cv::imshow((string *)auStack_6f8,&_Stack_718);
        if ((Size *)auStack_6f8._0_8_ != &SStack_6e8) {
          operator_delete((void *)auStack_6f8._0_8_,(ulong)((long)SStack_6e8 + 1));
        }
        lVar27 = lVar27 + 0x38;
      } while (lVar27 != 0x19c8);
      if (this->Test != false) {
        cv::waitKey(100);
      }
      iVar21 = WSNNode::layer(this->node + *piStack_740);
      if (iVar21 == 0) {
        dVar4 = this->alpha;
        WStack_408.leaderID = pWStack_6a8->leaderID;
        WStack_408.id = pWStack_6a8->id;
        uVar18._0_4_ = pWStack_6a8->x;
        uVar18._4_4_ = pWStack_6a8->y;
        WStack_408.energy = pWStack_6a8->energy;
        WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        WStack_408.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        uStack_438._0_4_ = pWStack_700->leaderID;
        uStack_438._4_4_ = pWStack_700->id;
        dVar5 = *(double *)pWStack_700;
        dStack_440 = pWStack_700->energy;
        dStack_430 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        dStack_428 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        dStack_420 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        dStack_418 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        uStack_448._4_4_ = (int)((ulong)dVar5 >> 0x20);
        iVar21 = uStack_448._4_4_;
        uStack_448 = dVar5;
        WStack_408._0_8_ = uVar18;
        iVar22 = WSNNode::GetNodeID(pWStack_6a8);
        iVar26 = (int)uVar18 - SUB84(dVar5,0);
        this->node[iVar22].energy =
             this->node[iVar22].energy -
             (dVar4 * (double)(iVar26 * iVar26 + (uVar18._4_4_ - iVar21) * (uVar18._4_4_ - iVar21))
             + 1.0);
        WSNNode::~WSNNode((WSNNode *)&uStack_448);
        WSNNode::~WSNNode(&WStack_408);
        iVar21 = *piStack_740;
        WStack_128.leaderID = this->node[iVar21].leaderID;
        WStack_128.id = this->node[iVar21].id;
        pWVar1 = this->node + iVar21;
        WStack_128.x = pWVar1->x;
        WStack_128.y = pWVar1->y;
        WStack_128.energy = pWVar1->energy;
        pSVar2 = &this->node[iVar21].color;
        WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
        WStack_128.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
        WStack_168.leaderID = pWStack_6a8->leaderID;
        WStack_168.id = pWStack_6a8->id;
        WStack_168.x = pWStack_6a8->x;
        WStack_168.y = pWStack_6a8->y;
        WStack_168.energy = pWStack_6a8->energy;
        WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        WStack_168.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (pSStack_6b0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        this->node[iVar21].energy =
             this->node[iVar21].energy -
             ((double)((WStack_128.y - WStack_168.y) * (WStack_128.y - WStack_168.y) +
                      (WStack_128.x - WStack_168.x) * (WStack_128.x - WStack_168.x)) * this->alpha +
             0.5);
        WSNNode::~WSNNode(&WStack_168);
        WSNNode::~WSNNode(&WStack_128);
        iVar21 = WSNNode::GetNodeID(pWStack_700);
        this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
        iVar21 = WSNNode::GetNodeID((WSNNode *)auStack_728._8_8_);
        this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
        iVar21 = WSNNode::GetNodeID((WSNNode *)auStack_728._0_8_);
        this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
        iVar21 = WSNNode::GetNodeID(pWVar31);
LAB_0010af75:
        this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
      }
      else {
        iVar21 = WSNNode::layer(this->node + *piStack_740);
        if (iVar21 == 1) {
          dVar4 = this->alpha;
          WStack_488.leaderID = pWStack_700->leaderID;
          WStack_488.id = pWStack_700->id;
          uVar17._0_4_ = pWStack_700->x;
          uVar17._4_4_ = pWStack_700->y;
          WStack_488.energy = pWStack_700->energy;
          WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          WStack_488.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_4b8 = *(undefined8 *)(auStack_728._8_8_ + 0x10);
          dVar5 = *(double *)auStack_728._8_8_;
          dStack_4c0 = *(double *)(auStack_728._8_8_ + 8);
          dStack_4b0 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_4a8 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_4a0 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_498 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_4c8._4_4_ = (int)((ulong)dVar5 >> 0x20);
          iVar21 = uStack_4c8._4_4_;
          uStack_4c8 = dVar5;
          WStack_488._0_8_ = uVar17;
          iVar22 = WSNNode::GetNodeID(pWStack_700);
          iVar26 = (int)uVar17 - SUB84(dVar5,0);
          this->node[iVar22].energy =
               this->node[iVar22].energy -
               (dVar4 * (double)(iVar26 * iVar26 + (uVar17._4_4_ - iVar21) * (uVar17._4_4_ - iVar21)
                                ) + 1.0);
          WSNNode::~WSNNode((WSNNode *)&uStack_4c8);
          WSNNode::~WSNNode(&WStack_488);
          iVar21 = *piStack_740;
          WStack_1a8.leaderID = this->node[iVar21].leaderID;
          WStack_1a8.id = this->node[iVar21].id;
          pWVar1 = this->node + iVar21;
          WStack_1a8.x = pWVar1->x;
          WStack_1a8.y = pWVar1->y;
          WStack_1a8.energy = pWVar1->energy;
          pSVar2 = &this->node[iVar21].color;
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
          WStack_1a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
          uStack_1d8._0_4_ = pWStack_700->leaderID;
          uStack_1d8._4_4_ = pWStack_700->id;
          dVar4 = *(double *)pWStack_700;
          dStack_1e0 = pWStack_700->energy;
          dStack_1d0 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_1c8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_1c0 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_1b8 = (pSStack_6c0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_1e8._0_4_ = SUB84(dVar4,0);
          uStack_1e8._4_4_ = (int)((ulong)dVar4 >> 0x20);
          this->node[iVar21].energy =
               this->node[iVar21].energy -
               ((double)((WStack_1a8.y - uStack_1e8._4_4_) * (WStack_1a8.y - uStack_1e8._4_4_) +
                        (WStack_1a8.x - (int)uStack_1e8) * (WStack_1a8.x - (int)uStack_1e8)) *
                this->alpha + 0.5);
          uStack_1e8 = dVar4;
          WSNNode::~WSNNode((WSNNode *)&uStack_1e8);
          WSNNode::~WSNNode(&WStack_1a8);
          iVar21 = WSNNode::GetNodeID((WSNNode *)auStack_728._8_8_);
          this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
          iVar21 = WSNNode::GetNodeID((WSNNode *)auStack_728._0_8_);
          this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
          iVar21 = WSNNode::GetNodeID(pWVar31);
          goto LAB_0010af75;
        }
        iVar21 = WSNNode::layer(this->node + *piStack_740);
        if (iVar21 == 2) {
          dVar4 = this->alpha;
          WStack_508._16_8_ = *(undefined8 *)(auStack_728._8_8_ + 0x10);
          WStack_508._0_8_ = *(undefined8 *)auStack_728._8_8_;
          WStack_508.energy = *(double *)(auStack_728._8_8_ + 8);
          WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          WStack_508.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_538 = *(undefined8 *)(auStack_728._0_8_ + 0x10);
          dVar5 = *(double *)auStack_728._0_8_;
          dStack_540 = *(double *)(auStack_728._0_8_ + 8);
          dStack_530 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_528 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_520 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_518 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          iVar20 = WStack_508.x;
          iVar21 = WStack_508.y;
          uStack_548._0_4_ = SUB84(dVar5,0);
          iVar22 = (int)uStack_548;
          uStack_548._4_4_ = (int)((ulong)dVar5 >> 0x20);
          iVar26 = uStack_548._4_4_;
          uStack_548 = dVar5;
          iVar23 = WSNNode::GetNodeID((WSNNode *)auStack_728._8_8_);
          iVar21 = iVar21 - iVar26;
          this->node[iVar23].energy =
               this->node[iVar23].energy -
               (dVar4 * (double)((iVar20 - iVar22) * (iVar20 - iVar22) + iVar21 * iVar21) + 1.0);
          WSNNode::~WSNNode((WSNNode *)&uStack_548);
          WSNNode::~WSNNode(&WStack_508);
          iVar21 = *piStack_740;
          WStack_228.leaderID = this->node[iVar21].leaderID;
          WStack_228.id = this->node[iVar21].id;
          pWVar1 = this->node + iVar21;
          WStack_228.x = pWVar1->x;
          WStack_228.y = pWVar1->y;
          WStack_228.energy = pWVar1->energy;
          pSVar2 = &this->node[iVar21].color;
          WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
          WStack_228.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
          uStack_258 = *(undefined8 *)(auStack_728._8_8_ + 0x10);
          dVar4 = *(double *)auStack_728._8_8_;
          dStack_260 = *(double *)(auStack_728._8_8_ + 8);
          dStack_250 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_248 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_240 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_238 = (pSStack_6c8->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_268._0_4_ = SUB84(dVar4,0);
          uStack_268._4_4_ = (int)((ulong)dVar4 >> 0x20);
          this->node[iVar21].energy =
               this->node[iVar21].energy -
               ((double)((WStack_228.y - uStack_268._4_4_) * (WStack_228.y - uStack_268._4_4_) +
                        (WStack_228.x - (int)uStack_268) * (WStack_228.x - (int)uStack_268)) *
                this->alpha + 0.5);
          uStack_268 = dVar4;
          WSNNode::~WSNNode((WSNNode *)&uStack_268);
          WSNNode::~WSNNode(&WStack_228);
          iVar21 = WSNNode::GetNodeID((WSNNode *)auStack_728._0_8_);
          this->node[iVar21].energy = this->node[iVar21].energy + -1.0;
          iVar21 = WSNNode::GetNodeID(pWVar31);
          goto LAB_0010af75;
        }
        iVar21 = WSNNode::layer(this->node + *piStack_740);
        dVar4 = this->alpha;
        if (iVar21 == 3) {
          WStack_588._16_8_ = *(undefined8 *)(auStack_728._0_8_ + 0x10);
          WStack_588._0_8_ = *(undefined8 *)auStack_728._0_8_;
          WStack_588.energy = *(double *)(auStack_728._0_8_ + 8);
          WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          WStack_588.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          WStack_5c8._16_8_ = *(undefined8 *)(auStack_728._0_8_ + 0x10);
          WStack_5c8._0_8_ = *(undefined8 *)auStack_728._0_8_;
          WStack_5c8.energy = *(double *)(auStack_728._0_8_ + 8);
          WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
               (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          WStack_5c8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
               (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          iVar20 = WStack_588.x;
          iVar21 = WStack_588.y;
          iVar22 = WStack_5c8.x;
          iVar26 = WStack_5c8.y;
          iVar23 = WSNNode::GetNodeID((WSNNode *)auStack_728._0_8_);
          iVar21 = iVar21 - iVar26;
          this->node[iVar23].energy =
               this->node[iVar23].energy -
               (dVar4 * (double)((iVar20 - iVar22) * (iVar20 - iVar22) + iVar21 * iVar21) + 1.0);
          WSNNode::~WSNNode(&WStack_5c8);
          WSNNode::~WSNNode(&WStack_588);
          iVar21 = *piStack_740;
          WStack_2a8.leaderID = this->node[iVar21].leaderID;
          WStack_2a8.id = this->node[iVar21].id;
          pWVar1 = this->node + iVar21;
          WStack_2a8.x = pWVar1->x;
          WStack_2a8.y = pWVar1->y;
          WStack_2a8.energy = pWVar1->energy;
          pSVar2 = &this->node[iVar21].color;
          WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
               (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
          WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
          WStack_2a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
          dStack_2d8 = *(double *)(auStack_728._0_8_ + 0x10);
          dVar4 = *(double *)auStack_728._0_8_;
          dStack_2e0 = *(double *)(auStack_728._0_8_ + 8);
          dStack_2d0 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
          dStack_2c8 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
          dStack_2c0 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
          dStack_2b8 = (pSStack_6d0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
          uStack_2e8._0_4_ = SUB84(dVar4,0);
          uStack_2e8._4_4_ = (int)((ulong)dVar4 >> 0x20);
          this->node[iVar21].energy =
               this->node[iVar21].energy -
               ((double)((WStack_2a8.y - uStack_2e8._4_4_) * (WStack_2a8.y - uStack_2e8._4_4_) +
                        (WStack_2a8.x - (int)uStack_2e8) * (WStack_2a8.x - (int)uStack_2e8)) *
                this->alpha + 0.5);
          uStack_2e8 = dVar4;
          WSNNode::~WSNNode((WSNNode *)&uStack_2e8);
          WSNNode::~WSNNode(&WStack_2a8);
          iVar21 = WSNNode::GetNodeID(pWVar31);
          goto LAB_0010af75;
        }
        WStack_608.leaderID = this->LayerLeaderNode[4].leaderID;
        WStack_608.id = this->LayerLeaderNode[4].id;
        uVar19._0_4_ = pWVar31->x;
        uVar19._4_4_ = pWVar31->y;
        WStack_608.energy = this->LayerLeaderNode[4].energy;
        WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             *(double *)pWStack_6b8;
        WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] = pWStack_6b8->energy;
        WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
             *(double *)&pWStack_6b8->leaderID;
        WStack_608.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
             (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
        uStack_638._0_4_ = pWStack_698->leaderID;
        uStack_638._4_4_ = pWStack_698->id;
        dVar5 = *(double *)pWStack_698;
        dStack_640 = pWStack_698->energy;
        dStack_630 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        dStack_628 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        dStack_620 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[2];
        dStack_618 = (pSStack_6a0->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[3];
        uStack_648._0_4_ = SUB84(dVar5,0);
        iVar21 = (int)uStack_648;
        uStack_648._4_4_ = (int)((ulong)dVar5 >> 0x20);
        iVar22 = uStack_648._4_4_;
        uStack_648 = dVar5;
        WStack_608._0_8_ = uVar19;
        iVar26 = WSNNode::GetNodeID(pWVar31);
        this->node[iVar26].energy =
             this->node[iVar26].energy -
             (dVar4 * (double)(((int)uVar19 - iVar21) * ((int)uVar19 - iVar21) +
                              (uVar19._4_4_ - iVar22) * (uVar19._4_4_ - iVar22)) + 1.0);
        WSNNode::~WSNNode((WSNNode *)&uStack_648);
        WSNNode::~WSNNode(&WStack_608);
        iVar21 = *piStack_740;
        WStack_328.leaderID = this->node[iVar21].leaderID;
        WStack_328.id = this->node[iVar21].id;
        pWVar1 = this->node + iVar21;
        WStack_328.x = pWVar1->x;
        WStack_328.y = pWVar1->y;
        WStack_328.energy = pWVar1->energy;
        pSVar2 = &this->node[iVar21].color;
        WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
        WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
             (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
        pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
        WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
        WStack_328.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
        uStack_358._0_4_ = this->LayerLeaderNode[4].leaderID;
        uStack_358._4_4_ = this->LayerLeaderNode[4].id;
        dVar4 = *(double *)pWVar31;
        dStack_360 = this->LayerLeaderNode[4].energy;
        dStack_350 = *(double *)pWStack_6b8;
        dStack_348 = pWStack_6b8->energy;
        dStack_340 = *(double *)&pWStack_6b8->leaderID;
        dStack_338 = (pWStack_6b8->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
        uStack_368._0_4_ = SUB84(dVar4,0);
        uStack_368._4_4_ = (int)((ulong)dVar4 >> 0x20);
        this->node[iVar21].energy =
             this->node[iVar21].energy -
             ((double)((WStack_328.y - uStack_368._4_4_) * (WStack_328.y - uStack_368._4_4_) +
                      (WStack_328.x - (int)uStack_368) * (WStack_328.x - (int)uStack_368)) *
              this->alpha + 0.5);
        uStack_368 = dVar4;
        WSNNode::~WSNNode((WSNNode *)&uStack_368);
        WSNNode::~WSNNode(&WStack_328);
      }
      iVar21 = *piStack_740;
      WStack_a8.leaderID = this->node[iVar21].leaderID;
      WStack_a8.id = this->node[iVar21].id;
      pWVar1 = this->node + iVar21;
      WStack_a8.x = pWVar1->x;
      WStack_a8.y = pWVar1->y;
      WStack_a8.energy = pWVar1->energy;
      pSVar2 = &this->node[iVar21].color;
      WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
           (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[0];
      WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
           (pSVar2->super_Vec<double,_4>).super_Matx<double,_4,_1>.val[1];
      pdVar3 = this->node[iVar21].color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val + 2;
      WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] = *pdVar3;
      WStack_a8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] = pdVar3[1];
      pWVar29 = (WSNTopologyBasedEnergy *)(auStack_70 + 0x20);
      pWVar28 = pWVar29;
      WSNNode::NodeColor((Scalar *)pWVar29,this->node + iVar21);
      drawCrossNode(pWVar28,&this->img,&WStack_a8,(Scalar *)pWVar29);
      WSNNode::~WSNNode(&WStack_a8);
      auStack_6f8._0_8_ = &SStack_6e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)auStack_6f8,"WSN","");
      _Stack_718.sz.width = 0;
      _Stack_718.sz.height = 0;
      _Stack_718.flags = 0x1010000;
      _Stack_718.obj = this;
      cv::imshow((string *)auStack_6f8,&_Stack_718);
      if ((Size *)auStack_6f8._0_8_ != &SStack_6e8) {
        operator_delete((void *)auStack_6f8._0_8_,(ulong)((long)SStack_6e8 + 1));
      }
      cv::Mat::~Mat((Mat *)apdStack_3c8);
      piStack_740 = piStack_740 + 1;
    } while (piStack_740 !=
             vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  pWVar31 = this->node;
  lVar27 = 100;
  do {
    WStack_e8.leaderID = pWVar31->leaderID;
    WStack_e8.id = pWVar31->id;
    WStack_e8.x = pWVar31->x;
    WStack_e8.y = pWVar31->y;
    WStack_e8.energy = pWVar31->energy;
    WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0] =
         (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[0];
    WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1] =
         (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[1];
    WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2] =
         (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[2];
    WStack_e8.color.super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3] =
         (pWVar31->color).super_Vec<double,_4>.super_Matx<double,_4,_1>.val[3];
    pWVar29 = (WSNTopologyBasedEnergy *)auStack_70;
    WSNNode::NodeColor((Scalar *)auStack_70,pWVar31);
    drawCrossNode(pWVar29,&this->img,&WStack_e8,(Scalar *)auStack_70);
    WSNNode::~WSNNode(&WStack_e8);
    apdStack_3c8[0] = adStack_3b8;
    std::__cxx11::string::_M_construct<char_const*>((string *)apdStack_3c8,"WSN","");
    SStack_6e8.width = 0;
    SStack_6e8.height = 0;
    auStack_6f8._0_4_ = 0x1010000;
    auStack_6f8._8_8_ = this;
    cv::imshow((string *)apdStack_3c8,(_InputArray *)auStack_6f8);
    if (apdStack_3c8[0] != adStack_3b8) {
      operator_delete(apdStack_3c8[0],(long)adStack_3b8[0] + 1);
    }
    pWVar31 = pWVar31 + 1;
    lVar27 = lVar27 + -1;
  } while (lVar27 != 0);
  if (this->Test != false) {
    cv::waitKey(400);
  }
  if (vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_678.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

int WSNTopologyBasedEnergy::MinMark()
{
	int min=Mark[0];
	int j=0;
	for(int i=0;i<LayerNum;i++)
	{
		if(Mark[i]<min)
		{
			min=Mark[i];
			j=i;
		}
	}
	return j;
}